

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O0

void __thiscall
asio::detail::
read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1313:23)>
::operator()(read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1313:23)>
             *this,error_code *ec,size_t bytes_transferred,int start)

{
  basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>
  *this_00;
  ulong uVar1;
  error_category *peVar2;
  bool bVar3;
  size_t sVar4;
  size_t total_transferred;
  error_code ec_00;
  mutable_buffer local_40;
  size_t local_30;
  size_t max_size;
  size_t sStack_20;
  int start_local;
  size_t bytes_transferred_local;
  error_code *ec_local;
  read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1313:23)>
  *this_local;
  
  this->start_ = start;
  max_size._4_4_ = start;
  sStack_20 = bytes_transferred;
  bytes_transferred_local = (size_t)ec;
  ec_local = (error_code *)this;
  if (start == 1) {
    sVar4 = consuming_single_buffer<asio::mutable_buffers_1>::total_consumed
                      (&(this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>);
    local_30 = base_from_completion_cond<asio::detail::transfer_at_least_t>::check_for_completion
                         (&this->super_base_from_completion_cond<asio::detail::transfer_at_least_t>,
                          ec,sVar4);
LAB_00140275:
    this_00 = (basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>
               *)this->stream_;
    local_40 = (mutable_buffer)
               consuming_single_buffer<asio::mutable_buffers_1>::prepare
                         (&(this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>,
                          local_30);
    basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>
    ::
    async_read_some<asio::mutable_buffers_1,asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_at_least_t,fineftp::FtpSession::receiveDataFromSocketAndWriteToFile(std::shared_ptr<fineftp::FtpSession::IoFile>,std::shared_ptr<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>>)::__0>>
              (this_00,(mutable_buffers_1 *)&local_40,this);
  }
  else {
    consuming_single_buffer<asio::mutable_buffers_1>::consume
              (&(this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>,
               bytes_transferred);
    bVar3 = std::error_code::operator_cast_to_bool((error_code *)bytes_transferred_local);
    if (((bVar3) || (sStack_20 != 0)) &&
       (bVar3 = consuming_single_buffer<asio::mutable_buffers_1>::empty
                          (&(this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>)
       , sVar4 = bytes_transferred_local, !bVar3)) {
      total_transferred =
           consuming_single_buffer<asio::mutable_buffers_1>::total_consumed
                     (&(this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>);
      local_30 = base_from_completion_cond<asio::detail::transfer_at_least_t>::check_for_completion
                           (&this->
                             super_base_from_completion_cond<asio::detail::transfer_at_least_t>,
                            (error_code *)sVar4,total_transferred);
      if (local_30 != 0) goto LAB_00140275;
    }
    uVar1 = *(ulong *)bytes_transferred_local;
    peVar2 = *(error_category **)(bytes_transferred_local + 8);
    sVar4 = consuming_single_buffer<asio::mutable_buffers_1>::total_consumed
                      (&(this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>);
    ec_00._0_8_ = uVar1 & 0xffffffff;
    ec_00._M_cat = peVar2;
    anon_class_64_4_d023f8a1_for_handler_::operator()(&this->handler_,ec_00,sVar4);
  }
  return;
}

Assistant:

void operator()(const asio::error_code& ec,
        std::size_t bytes_transferred, int start = 0)
    {
      std::size_t max_size;
      switch (start_ = start)
      {
        case 1:
        max_size = this->check_for_completion(ec, buffers_.total_consumed());
        do
        {
          {
            ASIO_HANDLER_LOCATION((__FILE__, __LINE__, "async_read"));
            stream_.async_read_some(buffers_.prepare(max_size),
                ASIO_MOVE_CAST(read_op)(*this));
          }
          return; default:
          buffers_.consume(bytes_transferred);
          if ((!ec && bytes_transferred == 0) || buffers_.empty())
            break;
          max_size = this->check_for_completion(ec, buffers_.total_consumed());
        } while (max_size > 0);

        handler_(ec, buffers_.total_consumed());
      }
    }